

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

VectorNd __thiscall HermiteSpline<5U,_2U>::interpolate(HermiteSpline<5U,_2U> *this,double s)

{
  reference pvVar1;
  size_type sVar2;
  vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_> *in_RSI;
  UnitBoundedPolynomial<5U,_2U> *in_RDI;
  bool bVar3;
  double in_XMM0_Qa;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> PVar4;
  double s_;
  int m;
  UnitBoundedPolynomial<5U,_2U> *this_00;
  double local_28;
  
  this_00 = in_RDI;
  local_28 = in_XMM0_Qa;
  while( true ) {
    pvVar1 = std::
             vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ::operator[](in_RSI,0);
    bVar3 = false;
    if (pvVar1->length <= local_28 && local_28 != pvVar1->length) {
      sVar2 = std::
              vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
              ::size(in_RSI);
      bVar3 = sVar2 != 0;
    }
    if (!bVar3) break;
    pvVar1 = std::
             vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ::operator[](in_RSI,0);
    local_28 = local_28 - pvVar1->length;
  }
  std::vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>::
  operator[](in_RSI,0);
  std::vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>::
  operator[](in_RSI,0);
  PVar4.m_storage.m_data.array =
       (DenseStorage<double,_2,_2,_1,_0>)
       UnitBoundedPolynomial<5U,_2U>::interpolate(this_00,(double)in_RDI);
  return (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)
         (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)PVar4.m_storage.m_data.array;
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}